

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall wasm::Wasm2JSBuilder::getImportName(Wasm2JSBuilder *this,Importable *imp)

{
  ValueBuilder *this_00;
  char *pcVar1;
  bool bVar2;
  Ref RVar3;
  Ref RVar4;
  char *in_RDX;
  Name name;
  IString name_00;
  IString str;
  IString name_01;
  IString IVar5;
  char *extraout_RDX;
  
  name.super_IString.str._M_str = in_RDX;
  name.super_IString.str._M_len = (size_t)(imp->base).super_IString.str._M_str;
  bVar2 = needsQuoting((wasm *)(imp->base).super_IString.str._M_len,name);
  IVar5 = fromName(this,(imp->module).super_IString.str,Top);
  name_00.str._M_str = IVar5.str._M_str;
  name_00.str._M_len = (size_t)name_00.str._M_str;
  RVar3 = cashew::ValueBuilder::makeName((ValueBuilder *)IVar5.str._M_len,name_00);
  this_00 = (ValueBuilder *)(imp->base).super_IString.str._M_len;
  pcVar1 = (imp->base).super_IString.str._M_str;
  if (bVar2) {
    str.str._M_str = extraout_RDX;
    str.str._M_len = (size_t)pcVar1;
    RVar4 = cashew::ValueBuilder::makeString(this_00,str);
    RVar3 = cashew::ValueBuilder::makeSub(RVar3,RVar4);
    return (Ref)RVar3.inst;
  }
  name_01.str._M_str = extraout_RDX;
  name_01.str._M_len = (size_t)pcVar1;
  RVar4 = cashew::ValueBuilder::makeName(this_00,name_01);
  RVar3 = cashew::ValueBuilder::makeDot(RVar3,RVar4);
  return (Ref)RVar3.inst;
}

Assistant:

Ref Wasm2JSBuilder::getImportName(const Importable& imp) {
  if (needsQuoting(imp.base)) {
    return ValueBuilder::makeSub(
      ValueBuilder::makeName(fromName(imp.module, NameScope::Top)),
      ValueBuilder::makeString(imp.base));
  } else {
    return ValueBuilder::makeDot(
      ValueBuilder::makeName(fromName(imp.module, NameScope::Top)),
      ValueBuilder::makeName(imp.base));
  }
}